

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<double,int,int(*)(char_const**,double*)>
               (int num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  float fVar8;
  code *pcVar9;
  char (*pacVar10) [16];
  char (*pacVar11) [16];
  double dVar12;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  char *pcVar13;
  uint uVar14;
  undefined8 *puVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 *puVar21;
  long lVar22;
  byte *__maxlen;
  undefined1 *__maxlen_00;
  bool bVar23;
  double num2;
  char *mp_num_pos2;
  char mp_nums [16] [16];
  char str [256];
  double dStack_bb8;
  undefined1 *puStack_bb0;
  char acStack_ba8 [256];
  undefined1 uStack_aa8;
  undefined8 uStack_aa7;
  undefined1 auStack_a9f [247];
  undefined8 *puStack_9a8;
  byte *pbStack_9a0;
  code *pcStack_998;
  double dStack_988;
  undefined8 *puStack_980;
  char (*pacStack_978) [16];
  char acStack_970 [256];
  byte bStack_870;
  undefined1 auStack_86f [2];
  undefined1 auStack_86d [6];
  undefined8 uStack_867;
  undefined8 uStack_85f;
  long lStack_768;
  ulong uStack_760;
  char *pcStack_758;
  char *pcStack_750;
  char *pcStack_748;
  code *pcStack_740;
  char (*pacStack_738) [16];
  char *pcStack_730;
  float fStack_728;
  undefined4 uStack_724;
  double dStack_720;
  double dStack_718;
  char (*pacStack_710) [16];
  char acStack_708 [256];
  byte bStack_608;
  undefined8 uStack_607;
  char acStack_5ff [255];
  long lStack_500;
  ulong uStack_4f8;
  char *pcStack_4f0;
  char *pcStack_4e8;
  char *pcStack_4e0;
  code *pcStack_4d8;
  char (*pacStack_4d0) [16];
  char *pcStack_4c8;
  float fStack_4c0;
  undefined4 uStack_4bc;
  double dStack_4b8;
  double dStack_4b0;
  code *pcStack_4a8;
  byte bStack_4a0;
  undefined8 uStack_49f;
  char acStack_497 [247];
  char acStack_3a0 [256];
  undefined1 auStack_2a0 [8];
  char *pcStack_298;
  ulong uStack_290;
  char *pcStack_288;
  long lStack_280;
  undefined1 *puStack_278;
  code *pcStack_270;
  code *local_268;
  float local_25c;
  double local_258;
  double local_250;
  char *local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  byte local_238;
  undefined8 local_237;
  char acStack_22f [247];
  char local_138 [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(local_138,"typed read of ",0xf);
  local_268 = (code *)(long)num1;
  if (num1 < 0) {
    pcVar13 = "%lld";
    pcVar9 = local_268;
  }
  else {
    pcVar13 = "%llu";
    pcVar9 = (code *)(ulong)(uint)num1;
  }
  pcStack_270 = (code *)0x130e95;
  local_240 = read_f;
  iVar4 = snprintf(local_138 + 0xe,0xf2,pcVar13,pcVar9);
  pcVar13 = local_138 + 0xe + iVar4;
  iVar5 = 0;
  pcStack_270 = (code *)0x130eb4;
  iVar4 = snprintf(pcVar13,(size_t)(local_38 + -(long)pcVar13)," into ");
  __maxlen_00 = local_38 + -(long)(pcVar13 + iVar4);
  pcStack_270 = (code *)0x130ece;
  snprintf(pcVar13 + iVar4,(size_t)__maxlen_00,"double");
  pcStack_270 = (code *)0x130edd;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x130ef6;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x130f06;
  fputs(local_138,_stdout);
  pcStack_270 = (code *)0x130f13;
  fputc(10,_stdout);
  if (-1 < num1) {
    pcStack_270 = (code *)0x130f24;
    iVar5 = test_encode_uint_all_sizes((char (*) [16])&local_238,(uint64_t)(ulong)(uint)num1);
  }
  pcVar17 = (char *)(&local_238 + (long)iVar5 * 0x10);
  pcStack_270 = (code *)0x130f42;
  pcVar13 = (char *)local_268;
  iVar4 = test_encode_int_all_sizes((char (*) [16])pcVar17,(int64_t)local_268);
  uVar14 = iVar5 + iVar4;
  if (uVar14 != 0 && SCARRY4(iVar5,iVar4) == (int)uVar14 < 0) {
    local_25c = (float)num1;
    local_258 = (double)num1;
    uVar20 = (ulong)uVar14;
    pcVar18 = (char *)((long)&local_237 + 1);
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    lVar22 = 0;
    do {
      lVar6 = lVar22 * 0x10;
      bVar1 = pcVar18[-2];
      pcVar9 = (code *)(ulong)bVar1;
      mVar2 = mp_type_hint[(long)pcVar9];
      pcVar19 = pcVar18;
      if (mVar2 == MP_UINT) {
        switch(bVar1) {
        case 0xcc:
          pcVar9 = (code *)(ulong)(byte)pcVar18[-1];
          break;
        case 0xcd:
          pcVar9 = (code *)(ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 |
                                          *(ushort *)(pcVar18 + -1) >> 8);
          pcVar19 = acStack_22f + lVar6 + -6;
          break;
        case 0xce:
          uVar14 = *(uint *)(pcVar18 + -1);
          pcVar9 = (code *)(ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                   (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
          pcVar19 = acStack_22f + lVar6 + -4;
          break;
        case 0xcf:
          uVar3 = *(ulong *)(pcVar18 + -1);
          pcVar9 = (code *)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                            (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                            (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
          pcVar19 = acStack_22f + lVar22 * 0x10;
          break;
        default:
          if ((char)bVar1 < '\0') {
LAB_001311cd:
            pcStack_270 = (code *)0x1311d2;
            test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d2:
            pcStack_270 = (code *)0x1311d7;
            test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_001311d7:
            pcStack_270 = (code *)0x1311f6;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar19 = acStack_22f + (lVar22 * 2 + -1) * 8;
        }
        if (pcVar9 != local_268) {
          pcStack_270 = (code *)0x13121f;
          test_read_num<double,int,int(*)(char_const**,double*)>();
LAB_0013121f:
          pcStack_270 = test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>;
          test_read_num<double,int,int(*)(char_const**,double*)>();
          pcStack_270 = (code *)0x139f88;
          builtin_strncpy(acStack_3a0,"typed read of ",0xf);
          pcStack_4d8 = (code *)0x13128b;
          uStack_4bc = extraout_EDX;
          pcStack_4a8 = (code *)pcVar13;
          pcStack_298 = pcVar19;
          uStack_290 = uVar20;
          pcStack_288 = pcVar18;
          lStack_280 = lVar22;
          puStack_278 = __maxlen_00;
          iVar4 = snprintf(acStack_3a0 + 0xe,0xf2,"%llu",pcVar17);
          pcVar13 = acStack_3a0 + (long)iVar4 + 0xe;
          pcStack_4d8 = (code *)0x1312af;
          iVar4 = snprintf(pcVar13,(size_t)(auStack_2a0 + -(long)pcVar13)," into ");
          pcStack_4d8 = (code *)0x1312c9;
          snprintf(pcVar13 + iVar4,(size_t)(auStack_2a0 + -(long)(pcVar13 + iVar4)),"double");
          pcStack_4d8 = (code *)0x1312d8;
          _space((FILE *)_stdout);
          pcStack_4d8 = (code *)0x1312f1;
          fwrite("# ",2,1,_stdout);
          pcStack_4d8 = (code *)0x131301;
          fputs(acStack_3a0,_stdout);
          pcStack_4d8 = (code *)0x13130e;
          fputc(10,_stdout);
          pcStack_4d8 = (code *)0x13131b;
          iVar4 = test_encode_uint_all_sizes((char (*) [16])&bStack_4a0,(uint64_t)pcVar17);
          pacVar11 = (char (*) [16])(&bStack_4a0 + (long)iVar4 * 0x10);
          pcStack_4d8 = (code *)0x131339;
          pacStack_4d0 = (char (*) [16])pcVar17;
          iVar5 = test_encode_int_all_sizes(pacVar11,(int64_t)pcVar17);
          uVar14 = iVar4 + iVar5;
          if (uVar14 == 0 || SCARRY4(iVar4,iVar5) != (int)uVar14 < 0) {
            return;
          }
          fStack_4c0 = (float)(long)pacStack_4d0;
          dStack_4b8 = (double)(long)pacStack_4d0;
          uVar20 = (ulong)uVar14;
          pcVar18 = (char *)((long)&uStack_49f + 1);
          lVar22 = 0;
          goto LAB_00131368;
        }
      }
      else if (mVar2 == MP_FLOAT) {
        if (bVar1 != 0xca) {
LAB_001311fb:
          pcStack_270 = (code *)0x13121a;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar14 = *(uint *)(pcVar18 + -1);
        fVar8 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                       uVar14 << 0x18);
        if ((fVar8 != local_25c) || (NAN(fVar8) || NAN(local_25c))) goto LAB_001311d2;
        pcVar19 = pcVar18 + 3;
      }
      else if (mVar2 == MP_INT) {
        pcVar9 = (code *)(long)(char)bVar1;
        switch(bVar1) {
        case 0xd0:
          pcVar9 = (code *)(long)pcVar18[-1];
          pcVar13 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
          break;
        case 0xd1:
          pcVar9 = (code *)(long)(short)(*(ushort *)(pcVar18 + -1) << 8 |
                                        *(ushort *)(pcVar18 + -1) >> 8);
          pcVar19 = acStack_22f + lVar6 + -6;
          pcVar13 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
          break;
        case 0xd2:
          uVar14 = *(uint *)(pcVar18 + -1);
          pcVar9 = (code *)(long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                       (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
          pcVar19 = acStack_22f + lVar6 + -4;
          pcVar13 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
          break;
        case 0xd3:
          uVar3 = *(ulong *)(pcVar18 + -1);
          pcVar9 = (code *)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                            (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                            (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
          pcVar19 = acStack_22f + lVar22 * 0x10;
          pcVar13 = (char *)&switchD_00130fc8::switchdataD_00139b8c;
          break;
        default:
          if (bVar1 < 0xe0) {
            pcStack_270 = (code *)0x1311cd;
            test_read_num<double,int,int(*)(char_const**,double*)>();
            goto LAB_001311cd;
          }
          pcVar19 = acStack_22f + (lVar22 * 2 + -1) * 8;
        }
        if (pcVar9 != local_268) goto LAB_0013121f;
      }
      else {
        if (bVar1 != 0xcb) goto LAB_001311d7;
        uVar3 = *(ulong *)(pcVar18 + -1);
        dVar12 = (double)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                          (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                          (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                          (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
        if ((dVar12 != local_258) || (NAN(dVar12) || NAN(local_258))) {
          pcStack_270 = (code *)0x1311fb;
          test_read_num<double,int,int(*)(char_const**,double*)>();
          goto LAB_001311fb;
        }
        pcVar19 = acStack_22f + lVar22 * 0x10;
      }
      local_248 = pcVar18 + -2;
      __maxlen_00 = (undefined1 *)(ulong)(uint)(int)(char)bVar1;
      local_250 = 0.0;
      pcStack_270 = (code *)0x131113;
      iVar4 = (*local_240)(&local_248,&local_250);
      pcStack_270 = (code *)0x13113b;
      _ok((uint)(iVar4 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",__maxlen_00);
      pcStack_270 = (code *)0x131163;
      _ok((uint)(pcVar19 == local_248),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      bVar23 = ABS(local_258 - local_250) < 1e-15;
      pcVar17 = (char *)(ulong)bVar23;
      pcVar13 = "double_eq(num1, num2)";
      pcStack_270 = (code *)0x1311a6;
      _ok((uint)bVar23,"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      lVar22 = lVar22 + 1;
      pcVar18 = pcVar18 + 0x10;
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
  }
  return;
LAB_00131368:
  lVar6 = lVar22 * 0x10;
  bVar1 = pcVar18[-2];
  pacVar10 = (char (*) [16])(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pacVar10];
  pcVar19 = pcVar18;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pacVar10 = (char (*) [16])(ulong)(byte)pcVar18[-1];
      break;
    case 0xcd:
      pacVar10 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar19 = acStack_497 + lVar6 + -6;
      break;
    case 0xce:
      uVar14 = *(uint *)(pcVar18 + -1);
      pacVar10 = (char (*) [16])
                 (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                        uVar14 << 0x18);
      pcVar19 = acStack_497 + lVar6 + -4;
      break;
    case 0xcf:
      uVar3 = *(ulong *)(pcVar18 + -1);
      pacVar10 = (char (*) [16])
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38);
      pcVar19 = acStack_497 + lVar22 * 0x10;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131627:
        pcStack_4d8 = (code *)0x13162c;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_0013162c:
        pcStack_4d8 = (code *)0x131631;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131631:
        pcStack_4d8 = (code *)0x131650;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar19 = acStack_497 + (lVar22 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_4d0) {
      pcStack_4d8 = (code *)0x131679;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
LAB_00131679:
      pcStack_4d8 = test_read_num<double,long_long,int(*)(char_const**,double*)>;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_708,"typed read of ",0xf);
      pcStack_740 = (code *)0x1316e2;
      uStack_724 = extraout_EDX_00;
      pacStack_710 = (char (*) [16])pcVar17;
      lStack_500 = lVar22;
      uStack_4f8 = uVar20;
      pcStack_4f0 = pcVar13;
      pcStack_4e8 = pcVar19;
      pcStack_4e0 = pcVar18;
      pcStack_4d8 = (code *)pcVar16;
      iVar4 = snprintf(acStack_708 + 0xe,0xf2,"%lld",pacVar11);
      pcVar13 = acStack_708 + (long)iVar4 + 0xe;
      pcStack_740 = (code *)0x131703;
      iVar4 = snprintf(pcVar13,(size_t)(&bStack_608 + -(long)pcVar13)," into ");
      pcStack_740 = (code *)0x13171d;
      snprintf(pcVar13 + iVar4,(size_t)(&bStack_608 + -(long)(pcVar13 + iVar4)),"double");
      pcStack_740 = (code *)0x13172c;
      _space((FILE *)_stdout);
      pcStack_740 = (code *)0x131745;
      fwrite("# ",2,1,_stdout);
      pcStack_740 = (code *)0x131752;
      fputs(acStack_708,_stdout);
      pcStack_740 = (code *)0x13175f;
      fputc(10,_stdout);
      pacVar10 = (char (*) [16])&bStack_608;
      pcStack_740 = (code *)0x131773;
      pacStack_738 = pacVar11;
      uVar14 = test_encode_int_all_sizes(pacVar10,(int64_t)pacVar11);
      if ((int)uVar14 < 1) {
        return;
      }
      fStack_728 = (float)(long)pacStack_738;
      dStack_720 = (double)(long)pacStack_738;
      uVar20 = (ulong)uVar14;
      pcVar17 = (char *)((long)&uStack_607 + 1);
      lVar22 = 0;
      goto LAB_001317a5;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131655:
      pcStack_4d8 = (code *)0x131674;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)(pcVar18 + -1);
    fVar8 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18);
    if ((fVar8 != fStack_4c0) || (NAN(fVar8) || NAN(fStack_4c0))) goto LAB_0013162c;
    pcVar19 = pcVar18 + 3;
  }
  else if (mVar2 == MP_INT) {
    pacVar10 = (char (*) [16])(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pacVar10 = (char (*) [16])(long)pcVar18[-1];
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      break;
    case 0xd1:
      pacVar10 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar18 + -1) << 8 | *(ushort *)(pcVar18 + -1) >> 8);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_497 + lVar6 + -6;
      break;
    case 0xd2:
      uVar14 = *(uint *)(pcVar18 + -1);
      pacVar10 = (char (*) [16])
                 (long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                            uVar14 << 0x18);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_497 + lVar6 + -4;
      break;
    case 0xd3:
      uVar3 = *(ulong *)(pcVar18 + -1);
      pacVar10 = (char (*) [16])
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38);
      pcVar17 = (char *)&switchD_001313bd::switchdataD_00139bac;
      pcVar19 = acStack_497 + lVar22 * 0x10;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_4d8 = (code *)0x131627;
        test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
        goto LAB_00131627;
      }
      pcVar19 = acStack_497 + (lVar22 * 2 + -1) * 8;
    }
    if (pacVar10 != pacStack_4d0) goto LAB_00131679;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131631;
    uVar3 = *(ulong *)(pcVar18 + -1);
    dVar12 = (double)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                      (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                      (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                      (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
    if ((dVar12 != dStack_4b8) || (NAN(dVar12) || NAN(dStack_4b8))) {
      pcStack_4d8 = (code *)0x131655;
      test_read_num<double,unsigned_long_long,int(*)(char_const**,double*)>();
      goto LAB_00131655;
    }
    pcVar19 = acStack_497 + lVar22 * 0x10;
  }
  pcVar16 = pcVar18 + -2;
  pcVar13 = (char *)(ulong)(uint)(int)(char)bVar1;
  dStack_4b0 = 0.0;
  pcStack_4d8 = (code *)0x131508;
  pcStack_4c8 = pcVar16;
  iVar4 = (*pcStack_4a8)(&pcStack_4c8,&dStack_4b0);
  if ((char)uStack_4bc == '\0') {
    pcStack_4d8 = (code *)0x1315d8;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar13);
    bVar23 = pcVar16 == pcStack_4c8;
    pcVar17 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_4d8 = (code *)0x131542;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar13);
    pcStack_4d8 = (code *)0x13156a;
    _ok((uint)(pcVar19 == pcStack_4c8),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar23 = ABS(dStack_4b8 - dStack_4b0) < 1e-15;
    pcVar17 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar11 = (char (*) [16])(ulong)bVar23;
  pcStack_4d8 = (code *)0x131600;
  _ok((uint)bVar23,pcVar17,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar19);
  lVar22 = lVar22 + 1;
  pcVar18 = pcVar18 + 0x10;
  uVar20 = uVar20 - 1;
  if (uVar20 == 0) {
    return;
  }
  goto LAB_00131368;
LAB_001317a5:
  lVar6 = lVar22 * 0x10;
  bVar1 = pcVar17[-2];
  pacVar11 = (char (*) [16])(ulong)bVar1;
  mVar2 = mp_type_hint[(long)pacVar11];
  pcVar18 = pcVar17;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      pacVar11 = (char (*) [16])(ulong)(byte)pcVar17[-1];
      break;
    case 0xcd:
      pacVar11 = (char (*) [16])
                 (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar18 = acStack_5ff + lVar6 + -6;
      break;
    case 0xce:
      uVar14 = *(uint *)(pcVar17 + -1);
      pacVar11 = (char (*) [16])
                 (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                        uVar14 << 0x18);
      pcVar18 = acStack_5ff + lVar6 + -4;
      break;
    case 0xcf:
      uVar3 = *(ulong *)(pcVar17 + -1);
      pacVar11 = (char (*) [16])
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38);
      pcVar18 = acStack_5ff + lVar22 * 0x10;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131a67:
        pcStack_740 = (code *)0x131a6c;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
        pcStack_740 = (code *)0x131a71;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
        pcStack_740 = (code *)0x131a90;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      pcVar18 = acStack_5ff + (lVar22 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_738) {
      pcStack_740 = (code *)0x131ab9;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
      pcStack_740 = test_read_num<double,float,int(*)(char_const**,double*)>;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_970,"typed read of ",0xf);
      pcStack_998 = (code *)0x131b1e;
      pacStack_978 = pacVar10;
      lStack_768 = lVar22;
      uStack_760 = uVar20;
      pcStack_758 = pcVar13;
      pcStack_750 = pcVar18;
      pcStack_748 = pcVar17;
      pcStack_740 = (code *)pcVar16;
      iVar4 = snprintf(acStack_970 + 0xe,0xf2,"%f",0x41590b2200000000);
      pcVar13 = acStack_970 + (long)iVar4 + 0xe;
      pcStack_998 = (code *)0x131b3f;
      iVar4 = snprintf(pcVar13,(size_t)(&bStack_870 + -(long)pcVar13)," into ");
      __maxlen = &bStack_870 + -(long)(pcVar13 + iVar4);
      pcStack_998 = (code *)0x131b59;
      snprintf(pcVar13 + iVar4,(size_t)__maxlen,"double");
      pcStack_998 = (code *)0x131b68;
      _space((FILE *)_stdout);
      lVar6 = 1;
      pcStack_998 = (code *)0x131b87;
      fwrite("# ",2,1,_stdout);
      pcStack_998 = (code *)0x131b94;
      fputs(acStack_970,_stdout);
      pcVar9 = (code *)0xa;
      pcStack_998 = (code *)0x131ba1;
      fputc(10,_stdout);
      puVar21 = (undefined8 *)(auStack_86f + 1);
      bStack_870 = 0xca;
      _auStack_86f = 0x1059c84a;
      uStack_867._7_1_ = 0xcb;
      uStack_85f = 0x220b5941;
      lVar22 = 0;
      goto LAB_00131bd0;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131a95:
      pcStack_740 = (code *)0x131ab4;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)(pcVar17 + -1);
    fVar8 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18);
    if ((fVar8 != fStack_728) || (NAN(fVar8) || NAN(fStack_728))) goto LAB_00131a6c;
    pcVar18 = pcVar17 + 3;
  }
  else if (mVar2 == MP_INT) {
    pacVar11 = (char (*) [16])(long)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      pacVar11 = (char (*) [16])(long)pcVar17[-1];
      break;
    case 0xd1:
      pacVar11 = (char (*) [16])
                 (long)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
      pcVar18 = acStack_5ff + lVar6 + -6;
      break;
    case 0xd2:
      uVar14 = *(uint *)(pcVar17 + -1);
      pacVar11 = (char (*) [16])
                 (long)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                            uVar14 << 0x18);
      pcVar18 = acStack_5ff + lVar6 + -4;
      break;
    case 0xd3:
      uVar3 = *(ulong *)(pcVar17 + -1);
      pacVar11 = (char (*) [16])
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38);
      pcVar18 = acStack_5ff + lVar22 * 0x10;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_740 = (code *)0x131a67;
        test_read_num<double,long_long,int(*)(char_const**,double*)>();
        goto LAB_00131a67;
      }
      pcVar18 = acStack_5ff + (lVar22 * 2 + -1) * 8;
    }
    if (pacVar11 != pacStack_738) goto LAB_00131ab9;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131a71;
    uVar3 = *(ulong *)(pcVar17 + -1);
    dVar12 = (double)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                      (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                      (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                      (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
    if ((dVar12 != dStack_720) || (NAN(dVar12) || NAN(dStack_720))) {
      pcStack_740 = (code *)0x131a95;
      test_read_num<double,long_long,int(*)(char_const**,double*)>();
      goto LAB_00131a95;
    }
    pcVar18 = acStack_5ff + lVar22 * 0x10;
  }
  pcVar16 = pcVar17 + -2;
  pcVar13 = (char *)(ulong)(uint)(int)(char)bVar1;
  dStack_718 = 0.0;
  pcStack_740 = (code *)0x131948;
  pcStack_730 = pcVar16;
  iVar4 = (*(code *)pacStack_710)(&pcStack_730,&dStack_718);
  if ((char)uStack_724 == '\0') {
    pcStack_740 = (code *)0x131a18;
    _ok((uint)(iVar4 == -1),"rc == -1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x737,"check failure for code 0x%02X",pcVar13);
    bVar23 = pcVar16 == pcStack_730;
    pcVar18 = "mp_num_pos2 == mp_nums[i]";
    iVar4 = 0x738;
    pcVar19 = "check position";
  }
  else {
    pcVar16 = 
    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
    pcStack_740 = (code *)0x131982;
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",pcVar13);
    pcStack_740 = (code *)0x1319aa;
    _ok((uint)(pcVar18 == pcStack_730),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    bVar23 = ABS(dStack_720 - dStack_718) < 1e-15;
    pcVar18 = "double_eq(num1, num2)";
    iVar4 = 0x73e;
    pcVar19 = "check float number";
  }
  pacVar10 = (char (*) [16])(ulong)bVar23;
  pcStack_740 = (code *)0x131a40;
  _ok((uint)bVar23,pcVar18,
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",iVar4,
      pcVar19);
  lVar22 = lVar22 + 1;
  pcVar17 = pcVar17 + 0x10;
  uVar20 = uVar20 - 1;
  if (uVar20 == 0) {
    return;
  }
  goto LAB_001317a5;
LAB_00131bd0:
  lVar7 = lVar22 * 0x10;
  bVar1 = *(byte *)((long)puVar21 + -2);
  uVar20 = (ulong)bVar1;
  mVar2 = mp_type_hint[uVar20];
  puVar15 = puVar21;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      uVar20 = (ulong)*(byte *)((long)puVar21 + -1);
      break;
    case 0xcd:
      uVar20 = (ulong)(ushort)(*(ushort *)((long)puVar21 + -1) << 8 |
                              *(ushort *)((long)puVar21 + -1) >> 8);
      puVar15 = (undefined8 *)(auStack_86d + lVar7);
      break;
    case 0xce:
      uVar14 = *(uint *)((long)puVar21 + -1);
      uVar20 = (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                      uVar14 << 0x18);
      puVar15 = (undefined8 *)(auStack_86d + lVar7 + 2);
      break;
    case 0xcf:
      uVar20 = *(ulong *)((long)puVar21 + -1);
      uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
               (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
               (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28
               | uVar20 << 0x38;
      puVar15 = &uStack_867 + lVar22 * 2;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131e46:
        pcStack_998 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_998 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_998 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar15 = (undefined8 *)(auStack_86f + lVar7);
    }
    if (uVar20 != 0x642c88) {
      pcStack_998 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_998 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_ba8,"typed read of ",0xf);
      puStack_9a8 = puVar15;
      pbStack_9a0 = __maxlen;
      pcStack_998 = (code *)lVar6;
      iVar4 = snprintf(acStack_ba8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar13 = acStack_ba8 + (long)iVar4 + 0xe;
      iVar4 = snprintf(pcVar13,(size_t)(&uStack_aa8 + -(long)pcVar13)," into ");
      snprintf(pcVar13 + iVar4,(size_t)(&uStack_aa8 + -(long)(pcVar13 + iVar4)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_ba8,_stdout);
      fputc(10,_stdout);
      uStack_aa8 = 0xcb;
      uStack_aa7 = 0xb81e85eb513816c0;
      puStack_bb0 = &uStack_aa8;
      dStack_bb8 = 0.0;
      iVar4 = (*pcVar9)(&puStack_bb0,&dStack_bb8);
      _ok((uint)(iVar4 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_a9f == puStack_bb0),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_bb8) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131e74:
      pcStack_998 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar14 = *(uint *)((long)puVar21 + -1);
    fVar8 = (float)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18);
    if ((fVar8 != 6.565e+06) || (NAN(fVar8))) goto LAB_00131e4b;
    puVar15 = (undefined8 *)((long)puVar21 + 3);
  }
  else if (mVar2 == MP_INT) {
    uVar20 = (ulong)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      uVar20 = (ulong)*(char *)((long)puVar21 + -1);
      break;
    case 0xd1:
      uVar20 = (ulong)(short)(*(ushort *)((long)puVar21 + -1) << 8 |
                             *(ushort *)((long)puVar21 + -1) >> 8);
      puVar15 = (undefined8 *)(auStack_86d + lVar7);
      break;
    case 0xd2:
      uVar14 = *(uint *)((long)puVar21 + -1);
      uVar20 = (ulong)(int)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                           uVar14 << 0x18);
      puVar15 = (undefined8 *)(auStack_86d + lVar7 + 2);
      break;
    case 0xd3:
      uVar20 = *(ulong *)((long)puVar21 + -1);
      uVar20 = uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
               (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
               (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 | (uVar20 & 0xff00) << 0x28
               | uVar20 << 0x38;
      puVar15 = &uStack_867 + lVar22 * 2;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_998 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar15 = (undefined8 *)(auStack_86f + lVar7);
    }
    if (uVar20 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131e50;
    uVar20 = *(ulong *)((long)puVar21 + -1);
    dVar12 = (double)(uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                      (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                      (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                      (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38);
    if ((dVar12 != 6565000.0) || (NAN(dVar12))) {
      pcStack_998 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar15 = &uStack_867 + lVar22 * 2;
  }
  puStack_980 = (undefined8 *)((long)puVar21 + -2);
  __maxlen = (byte *)(ulong)(uint)(int)(char)bVar1;
  dStack_988 = 0.0;
  pcStack_998 = (code *)0x131d8a;
  iVar4 = (*(code *)pacStack_978)(&puStack_980,&dStack_988);
  pcStack_998 = (code *)0x131db2;
  _ok((uint)(iVar4 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_998 = (code *)0x131dda;
  _ok((uint)(puVar15 == puStack_980),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar23 = ABS(6565000.0 - dStack_988) < 1e-15;
  pcVar9 = (code *)(ulong)bVar23;
  pcStack_998 = (code *)0x131e1f;
  _ok((uint)bVar23,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar22 = lVar22 + 1;
  puVar21 = puVar21 + 2;
  lVar6 = lVar6 + -1;
  if (lVar6 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}